

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_custom_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowCustomAggregatorState::WindowCustomAggregatorState
          (WindowCustomAggregatorState *this,AggregateObject *aggr,WindowExcludeMode exclude_mode)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  FunctionNullHandling FVar8;
  FunctionErrors FVar9;
  FunctionCollationHandling FVar10;
  AggregateDistinctDependent AVar11;
  idx_t iVar12;
  PhysicalType PVar13;
  undefined2 uVar14;
  Allocator *allocator;
  idx_t iVar15;
  pointer pFVar16;
  long lVar17;
  aggregate_size_t *pp_Var18;
  aggregate_size_t *pp_Var19;
  byte bVar20;
  Value local_70;
  
  bVar20 = 0;
  (this->super_WindowAggregatorLocalState).super_WindowAggregatorState._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowAggregatorState_024b58f0;
  allocator = Allocator::DefaultAllocator();
  ArenaAllocator::ArenaAllocator
            (&(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator,
             allocator,0x800);
  (this->super_WindowAggregatorLocalState).cursor.
  super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
  super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl = (WindowCursor *)0x0;
  (this->super_WindowAggregatorLocalState).super_WindowAggregatorState._vptr_WindowAggregatorState =
       (_func_int **)&PTR__WindowCustomAggregatorState_024b4e00;
  SimpleFunction::SimpleFunction((SimpleFunction *)&this->aggr,(SimpleFunction *)aggr);
  (this->aggr).function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
       = (_func_int **)&PTR__BaseScalarFunction_0247c9f0;
  LogicalType::LogicalType
            (&(this->aggr).function.super_BaseScalarFunction.return_type,
             &(aggr->function).super_BaseScalarFunction.return_type);
  FVar8 = (aggr->function).super_BaseScalarFunction.null_handling;
  FVar9 = (aggr->function).super_BaseScalarFunction.errors;
  FVar10 = (aggr->function).super_BaseScalarFunction.collation_handling;
  (this->aggr).function.super_BaseScalarFunction.stability =
       (aggr->function).super_BaseScalarFunction.stability;
  (this->aggr).function.super_BaseScalarFunction.null_handling = FVar8;
  (this->aggr).function.super_BaseScalarFunction.errors = FVar9;
  (this->aggr).function.super_BaseScalarFunction.collation_handling = FVar10;
  (this->aggr).function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function
       = (_func_int **)&PTR__AggregateFunction_0247f8b8;
  pp_Var18 = &(aggr->function).state_size;
  pp_Var19 = &(this->aggr).function.state_size;
  for (lVar17 = 0xd; lVar17 != 0; lVar17 = lVar17 + -1) {
    *pp_Var19 = *pp_Var18;
    pp_Var18 = pp_Var18 + (ulong)bVar20 * -2 + 1;
    pp_Var19 = pp_Var19 + (ulong)bVar20 * -2 + 1;
  }
  AVar11 = (aggr->function).distinct_dependent;
  (this->aggr).function.order_dependent = (aggr->function).order_dependent;
  (this->aggr).function.distinct_dependent = AVar11;
  (this->aggr).function.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (aggr->function).function_info.internal.
       super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (aggr->function).function_info.internal.
           super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->aggr).function.function_info.internal.
  super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->aggr).bind_data_wrapper.internal.
  super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (aggr->bind_data_wrapper).internal.
       super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (aggr->bind_data_wrapper).internal.
           super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->aggr).bind_data_wrapper.internal.
  super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  iVar15 = aggr->child_count;
  uVar3 = *(undefined4 *)((long)&aggr->child_count + 4);
  iVar12 = aggr->payload_size;
  uVar4 = *(undefined4 *)((long)&aggr->payload_size + 4);
  PVar13 = aggr->return_type;
  uVar14 = *(undefined2 *)&aggr->field_0x152;
  uVar5 = *(undefined4 *)&aggr->field_0x154;
  uVar6 = *(undefined4 *)&aggr->filter;
  uVar7 = *(undefined4 *)((long)&aggr->filter + 4);
  (this->aggr).aggr_type = aggr->aggr_type;
  (this->aggr).return_type = PVar13;
  *(undefined2 *)&(this->aggr).field_0x152 = uVar14;
  *(undefined4 *)&(this->aggr).field_0x154 = uVar5;
  *(undefined4 *)&(this->aggr).filter = uVar6;
  *(undefined4 *)((long)&(this->aggr).filter + 4) = uVar7;
  *(int *)&(this->aggr).child_count = (int)iVar15;
  *(undefined4 *)((long)&(this->aggr).child_count + 4) = uVar3;
  *(int *)&(this->aggr).payload_size = (int)iVar12;
  *(undefined4 *)((long)&(this->aggr).payload_size + 4) = uVar4;
  iVar15 = (*(aggr->function).state_size)(&aggr->function);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>,iVar15,
             (allocator_type *)&local_70);
  Value::POINTER(&local_70,
                 (uintptr_t)
                 (this->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
  Vector::Vector(&this->statef,&local_70);
  Value::~Value(&local_70);
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pFVar16 = (pointer)operator_new(0x30);
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_start = pFVar16;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_finish = pFVar16;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pFVar16 + 3;
  pFVar16[2].start = 0;
  pFVar16[2].end = 0;
  pFVar16[1].start = 0;
  pFVar16[1].end = 0;
  pFVar16->start = 0;
  pFVar16->end = 0;
  (this->frames).super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
  super__Vector_impl_data._M_finish = pFVar16 + 3;
  (*(aggr->function).initialize)
            (&aggr->function,
             (this->state).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  WindowAggregatorLocalState::InitSubFrames(&this->frames,exclude_mode);
  return;
}

Assistant:

WindowCustomAggregatorState::WindowCustomAggregatorState(const AggregateObject &aggr,
                                                         const WindowExcludeMode exclude_mode)
    : aggr(aggr), state(aggr.function.state_size(aggr.function)),
      statef(Value::POINTER(CastPointerToValue(state.data()))), frames(3, {0, 0}) {
	// if we have a frame-by-frame method, share the single state
	aggr.function.initialize(aggr.function, state.data());

	InitSubFrames(frames, exclude_mode);
}